

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXWebSocketTransport.cpp
# Opt level: O1

void __thiscall ix::WebSocketTransport::WebSocketTransport(WebSocketTransport *this)

{
  rep rVar1;
  
  (this->_url)._M_dataplus._M_p = (pointer)&(this->_url).field_2;
  (this->_url)._M_string_length = 0;
  (this->_url).field_2._M_local_buf[0] = '\0';
  (this->_useMask)._M_base._M_i = true;
  (this->_readbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_readbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_readbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rxbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rxbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rxbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_txbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_txbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_txbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_txbufMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_txbufMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_txbufMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_txbufMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_txbufMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_chunks).
  super__List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_chunks;
  (this->_chunks).
  super__List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_chunks;
  (this->_chunks).
  super__List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->_socket).super___shared_ptr<ix::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_socket).super___shared_ptr<ix::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_readyState)._M_i = CLOSED;
  *(undefined8 *)&(this->_onCloseCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_onCloseCallback).super__Function_base._M_functor + 8) = 0;
  (this->_onCloseCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_onCloseCallback)._M_invoker = (_Invoker_type)0x0;
  this->_closeCode = 0x3f3;
  (this->_closeReason)._M_dataplus._M_p = (pointer)&(this->_closeReason).field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_closeReason,kInternalErrorMessage_abi_cxx11_,
             DAT_001ec368 + kInternalErrorMessage_abi_cxx11_);
  this->_closeWireSize = 0;
  this->_closeRemote = false;
  (this->_closeDataMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_closeDataMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_closeDataMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_closeDataMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_closeDataMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  WebSocketPerMessageDeflate::WebSocketPerMessageDeflate(&this->_perMessageDeflate);
  WebSocketPerMessageDeflateOptions::WebSocketPerMessageDeflateOptions
            (&this->_perMessageDeflateOptions,false,false,false,'\x0f','\x0f');
  this->_enablePerMessageDeflate = (__atomic_base<bool>)0x0;
  this->_requestInitCancellation = (__atomic_base<bool>)0x0;
  (this->_closingTimePointMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_closingTimePointMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_closingTimePointMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_closingTimePointMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_closingTimePointMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_closingTimePoint).__d.__r = rVar1;
  (this->_enablePong)._M_base._M_i = true;
  this->_pingIntervalSecs = -1;
  this->_pingTimeoutSecs = -1;
  this->_pingIntervalOrTimeoutGCDSecs = -1;
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_nextGCDTimePoint).__d.__r = rVar1;
  (this->_lastSendPingTimePointMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_lastSendPingTimePointMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_lastSendPingTimePointMutex).super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->_lastSendPingTimePointMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_lastSendPingTimePointMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_lastReceivePongTimePointMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_lastReceivePongTimePointMutex).super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(this->_lastReceivePongTimePointMutex).super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->_lastReceivePongTimePointMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_lastReceivePongTimePointMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_lastSendPingTimePoint).__d.__r = rVar1;
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_lastReceivePongTimePoint).__d.__r = rVar1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_readbuf,0x8000);
  return;
}

Assistant:

WebSocketTransport::WebSocketTransport() :
        _useMask(true),
        _readyState(CLOSED),
        _closeCode(kInternalErrorCode),
        _closeReason(kInternalErrorMessage),
        _closeWireSize(0),
        _closeRemote(false),
        _enablePerMessageDeflate(false),
        _requestInitCancellation(false),
        _closingTimePoint(std::chrono::steady_clock::now()),
        _enablePong(kDefaultEnablePong),
        _pingIntervalSecs(kDefaultPingIntervalSecs),
        _pingTimeoutSecs(kDefaultPingTimeoutSecs),
        _pingIntervalOrTimeoutGCDSecs(-1),
        _nextGCDTimePoint(std::chrono::steady_clock::now()),
        _lastSendPingTimePoint(std::chrono::steady_clock::now()),
        _lastReceivePongTimePoint(std::chrono::steady_clock::now())
    {
        _readbuf.resize(kChunkSize);
    }